

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::Number> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Number>(RecursiveDescentParser *this)

{
  string *psVar1;
  uint uVar2;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Number> sVar3;
  int64_t val;
  allocator local_330 [32];
  istringstream in;
  uint auStack_2f8 [2];
  byte abStack_2f0 [352];
  ostringstream out;
  socklen_t *__addr_len;
  
  std::make_shared<MyCompiler::Number>();
  if (in_RSI->sym != NUMBER) {
    std::__cxx11::string::string((string *)&in,"number expected",(allocator *)&out);
    except(in_RSI,NUMBER,(string *)&in);
    std::__cxx11::string::~string((string *)&in);
  }
  psVar1 = Token::getValue_abi_cxx11_(&in_RSI->currentToken);
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)psVar1,_S_in);
  *(uint *)((long)auStack_2f8 + *(long *)(_in + -0x18)) =
       *(uint *)((long)auStack_2f8 + *(long *)(_in + -0x18)) & 0xfffffdff;
  uVar2 = *(uint *)((long)auStack_2f8 + *(long *)(_in + -0x18)) & 0xffffffb5 | 2;
  __addr_len = (socklen_t *)(ulong)uVar2;
  *(uint *)((long)auStack_2f8 + *(long *)(_in + -0x18)) = uVar2;
  std::istream::_M_extract<long>((long *)&in);
  if (((abStack_2f0[*(long *)(_in + -0x18)] & 5) != 0) || ((int)val != val)) {
    std::__cxx11::string::string((string *)&out,"this number is too large",local_330);
    except(in_RSI,NUMBER,(string *)&out);
    std::__cxx11::string::~string((string *)&out);
  }
  Number::setNum((Number *)this->stream,val);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  std::ostream::_M_insert<long>((long)&out);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)(this->stream + 0x28),(string *)local_330);
  std::__cxx11::string::~string((string *)local_330);
  accept(in_RSI,in_RSI->sym,__addr,__addr_len);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  std::__cxx11::istringstream::~istringstream((istringstream *)&in);
  sVar3.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Number>)
         sVar3.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Number> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Number>();

    if (sym != SymbolType::NUMBER)
        except(SymbolType::NUMBER, "number expected");
    int64_t val;
    std::istringstream in(currentToken.getValue());
    in >> std::noshowbase >> std::setbase(10) >> val;
    if (in.fail() || val > std::numeric_limits<int32_t>::max() || val < std::numeric_limits<int32_t>::min())
        except(SymbolType::NUMBER, "this number is too large");
    pResult->setNum(val);
    std::ostringstream out;
    out << val;
    pResult->value = out.str();
    accept(sym);

    return pResult;
}